

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall Tree::BuildVirtualFolderImpl(Tree *this,string *virtualFolders,string *prefix)

{
  string *virtualFolders_00;
  bool bVar1;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_a0;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_98;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *prefix_local;
  string *virtualFolders_local;
  Tree *this_local;
  
  local_20 = prefix;
  prefix_local = virtualFolders;
  virtualFolders_local = &this->path;
  std::operator+(&local_80,"CMake Files\\",prefix);
  std::operator+(&local_60,&local_80,&this->path);
  std::operator+(&local_40,&local_60,"\\;");
  std::__cxx11::string::operator+=((string *)prefix_local,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  local_98._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  while( true ) {
    local_a0._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
    bVar1 = __gnu_cxx::operator!=(&local_98,&local_a0);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator->(&local_98);
    virtualFolders_00 = prefix_local;
    std::operator+(&local_e0,local_20,&this->path);
    std::operator+(&local_c0,&local_e0,"\\");
    BuildVirtualFolderImpl(this_00,virtualFolders_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&local_98);
  }
  return;
}

Assistant:

void Tree::BuildVirtualFolderImpl(std::string& virtualFolders,
                                  const std::string& prefix) const
{
  virtualFolders += "CMake Files\\" + prefix +  path + "\\;";
  for (std::vector<Tree>::const_iterator it = folders.begin();
       it != folders.end();
     ++it)
    {
    it->BuildVirtualFolderImpl(virtualFolders, prefix + path + "\\");
    }
}